

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

string * __thiscall
t_c_glib_generator::constant_value_with_storage
          (string *__return_storage_ptr__,t_c_glib_generator *this,string *fname,t_type *etype,
          t_const_value *value)

{
  bool bVar1;
  ostream *poVar2;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1a8 [8];
  ostringstream render;
  t_const_value *value_local;
  t_type *etype_local;
  string *fname_local;
  t_c_glib_generator *this_local;
  
  render._368_8_ = value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  bVar1 = is_numeric(this,etype);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)local_1a8,"    ");
    type_name_abi_cxx11_(&local_1d8,this,etype,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_1d8);
    poVar2 = std::operator<<(poVar2," *");
    poVar2 = std::operator<<(poVar2,(string *)fname);
    poVar2 = std::operator<<(poVar2," = ");
    poVar2 = std::operator<<(poVar2,"g_new (");
    base_type_name_abi_cxx11_(&local_1f8,this,etype);
    poVar2 = std::operator<<(poVar2,(string *)&local_1f8);
    poVar2 = std::operator<<(poVar2,", 1);");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"    *");
    poVar2 = std::operator<<(poVar2,(string *)fname);
    poVar2 = std::operator<<(poVar2," = ");
    std::__cxx11::string::string((string *)&local_238,(string *)fname);
    constant_value(&local_218,this,&local_238,etype,(t_const_value *)render._368_8_);
    poVar2 = std::operator<<(poVar2,(string *)&local_218);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  else {
    poVar2 = std::operator<<((ostream *)local_1a8,"    ");
    type_name_abi_cxx11_(&local_258,this,etype,false,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_258);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,(string *)fname);
    poVar2 = std::operator<<(poVar2," = ");
    std::__cxx11::string::string((string *)&local_298,(string *)fname);
    constant_value(&local_278,this,&local_298,etype,(t_const_value *)render._368_8_);
    poVar2 = std::operator<<(poVar2,(string *)&local_278);
    poVar2 = std::operator<<(poVar2,";");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_258);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::constant_value_with_storage(string fname,
                                                       t_type* etype,
                                                       t_const_value* value) {
  ostringstream render;
  if (is_numeric(etype)) {
    render << "    " << type_name(etype) << " *" << fname << " = "
           << "g_new (" << base_type_name(etype) << ", 1);" << endl
           << "    *" << fname << " = " << constant_value(fname, (t_type*)etype, value) << ";"
           << endl;
  } else {
    render << "    " << type_name(etype) << " " << fname << " = "
           << constant_value(fname, (t_type*)etype, value) << ";" << endl;
  }
  return render.str();
}